

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alu_operations.c
# Opt level: O1

void alu_operations(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  status_register_t *psVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar1 = thminstr->raw;
  uVar5 = (uint)uVar1;
  uVar7 = (uint)uVar1;
  switch(uVar1 >> 6 & 0xf) {
  case 0:
    uVar5 = *(uint *)((long)state->r + (ulong)(uVar1 >> 1 & 0x1c));
    goto LAB_0010e7da;
  case 1:
    uVar7 = state->r[uVar7 & 7];
    uVar5 = *(uint *)((long)state->r + (ulong)(uVar1 >> 1 & 0x1c));
    uVar6 = uVar5 ^ uVar7;
    psVar2 = get_psr(state);
    bVar9 = uVar7 == uVar5;
    goto LAB_0010e971;
  case 2:
    uVar6 = arm_shift(&state->cpsr,LSL,state->r[uVar7 & 7],
                      *(uint32_t *)((long)state->r + (ulong)(uVar1 >> 1 & 0x1c)));
    break;
  case 3:
    uVar6 = arm_lsr(&state->cpsr,state->r[uVar5 & 7],
                    *(uint32_t *)((long)state->r + (ulong)(uVar1 >> 1 & 0x1c)));
    break;
  case 4:
    uVar6 = arm_asr(&state->cpsr,state->r[uVar5 & 7],
                    *(uint32_t *)((long)state->r + (ulong)(uVar1 >> 1 & 0x1c)));
    break;
  case 5:
    uVar7 = state->r[uVar5 & 7];
    uVar5 = (state->cpsr).raw >> 0x1d & 1;
    uVar3 = uVar5 + state->r[uVar1 >> 3 & 7];
    uVar6 = uVar3 + uVar7;
    uVar8 = (ulong)uVar7 + (ulong)uVar5 + (ulong)uVar3;
    (state->cpsr).raw =
         (~(uVar3 ^ uVar7) & ((uint)uVar8 ^ uVar7)) >> 3 & 0x10000000 |
         (state->cpsr).raw & 0xcfffffff | (uint)(uVar8 >> 0x20 != 0) << 0x1d;
    psVar2 = get_psr(state);
    uVar7 = uVar6 & 0x80000000 | psVar2->raw & 0x3fffffff | (uint)(uVar6 == 0) << 0x1e;
    goto LAB_0010e98a;
  case 6:
    uVar7 = state->r[uVar5 & 7];
    uVar5 = state->r[uVar1 >> 3 & 7];
    uVar3 = ((int)((state->cpsr).raw * 4) >> 0x1f) + uVar5 + 1;
    uVar6 = uVar7 - uVar3;
    (state->cpsr).raw =
         (~(uVar5 ^ uVar6) & (uVar5 ^ uVar7)) >> 3 & 0x10000000 |
         (state->cpsr).raw & 0xcfffffff | (uint)(uVar3 <= uVar7) << 0x1d;
    psVar2 = get_psr(state);
    psVar2->raw = uVar6 & 0x80000000 | psVar2->raw & 0x3fffffff | (uint)(uVar6 == 0) << 0x1e;
    goto LAB_0010e98c;
  case 7:
    uVar6 = arm_ror(&state->cpsr,state->r[uVar1 & 7],state->r[uVar1 >> 3 & 7]);
    break;
  case 8:
    uVar7 = state->r[uVar1 >> 3 & 7] & state->r[uVar1 & 7];
    goto LAB_0010eb98;
  case 9:
    uVar7 = state->r[uVar1 >> 3 & 7];
    uVar6 = -uVar7;
    psVar2 = get_psr(state);
    psVar2->raw = uVar6 & 0x80000000 | (uint)(uVar7 == 0) << 0x1e | psVar2->raw & 0x3fffffff;
    (state->cpsr).raw =
         (uVar7 & uVar6) >> 3 & 0x30000000 | (uint)(uVar7 == 0) << 0x1d |
         (state->cpsr).raw & 0xcfffffff;
    goto LAB_0010e98c;
  case 10:
    uVar7 = state->r[uVar1 & 7];
    uVar5 = state->r[uVar1 >> 3 & 7];
    psVar2 = get_psr(state);
    uVar3 = uVar7 - uVar5;
    psVar2->raw = uVar3 & 0x80000000 | (uint)(uVar3 == 0) << 0x1e | psVar2->raw & 0x3fffffff;
    (state->cpsr).raw =
         (~(uVar3 ^ uVar5) & (uVar7 ^ uVar5)) >> 3 & 0x10000000 |
         (state->cpsr).raw & 0xcfffffff | (uint)(uVar5 <= uVar7) << 0x1d;
    return;
  case 0xb:
    uVar7 = state->r[uVar7 & 7];
    lVar4 = (ulong)state->r[uVar1 >> 3 & 7] + (ulong)uVar7;
    (state->cpsr).raw =
         (~(state->r[uVar1 >> 3 & 7] ^ uVar7) & ((uint)lVar4 ^ uVar7)) >> 3 & 0x10000000 |
         (state->cpsr).raw & 0xcfffffff | (int)((ulong)lVar4 >> 0x20) << 0x1d;
    uVar7 = *(int *)((long)state->r + (ulong)(thminstr->raw >> 1 & 0x1c)) +
            state->r[thminstr->raw & 7];
LAB_0010eb98:
    psVar2 = get_psr(state);
    psVar2->raw = uVar7 & 0x80000000 | (uint)(uVar7 == 0) << 0x1e | psVar2->raw & 0x3fffffff;
    return;
  case 0xc:
    uVar6 = state->r[uVar1 >> 3 & 7] | state->r[uVar7 & 7];
    break;
  case 0xd:
    uVar6 = state->r[uVar1 >> 3 & 7] * state->r[uVar7 & 7];
    break;
  case 0xe:
    uVar5 = ~state->r[uVar1 >> 3 & 7];
LAB_0010e7da:
    uVar6 = uVar5 & state->r[uVar7 & 7];
    break;
  case 0xf:
    uVar7 = state->r[uVar1 >> 3 & 7];
    uVar6 = ~uVar7;
    psVar2 = get_psr(state);
    bVar9 = uVar7 == 0xffffffff;
    goto LAB_0010e971;
  }
  psVar2 = get_psr(state);
  bVar9 = uVar6 == 0;
LAB_0010e971:
  uVar7 = uVar6 & 0x80000000 | (uint)bVar9 << 0x1e | psVar2->raw & 0x3fffffff;
LAB_0010e98a:
  psVar2->raw = uVar7;
LAB_0010e98c:
  uVar1 = thminstr->raw;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)(uVar1 & 7),(ulong)uVar6);
  }
  state->r[uVar1 & 7] = uVar6;
  return;
}

Assistant:

void alu_operations(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    alu_operations_t* instr = &thminstr->ALU_OPERATIONS;
    switch (instr->opcode) {
        case 0x0: { // AND: Rd = Rd AND Rs
            word newvalue = get_register(state, instr->rd) & get_register(state, instr->rs);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        case 0x1: { // EOR: Rd = Rd ^ Rs
            word newvalue = get_register(state, instr->rd) ^ get_register(state, instr->rs);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        case 0x2: { // LSL: Rd = Rd << Rs
            word newvalue = get_register(state, instr->rd);
            word shift_amount = get_register(state, instr->rs);
            newvalue = arm_shift(&state->cpsr, LSL, newvalue, shift_amount);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        case 0x3: { // LSR: Rd = Rd >> Rs
            word newvalue = get_register(state, instr->rd);
            word shift_amount = get_register(state, instr->rs);
            newvalue = arm_lsr(&state->cpsr, newvalue, shift_amount);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        case 0x4: { // ASR: Rd = Rd ASR Rs
            word newvalue = get_register(state, instr->rd);
            word shift_amount = get_register(state, instr->rs);
            newvalue = arm_asr(&state->cpsr, newvalue, shift_amount);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        case 0x5: { // ADC: Rd = Rd + Rs + C
            uint64_t rddata = get_register(state, instr->rd);
            uint64_t rsdata = get_register(state, instr->rs) + state->cpsr.C;
            word result = rddata + rsdata;
            set_flags_adc(state, rddata, rsdata, state->cpsr.C);
            set_flags_nz(state, result);
            set_register(state, instr->rd, result);
            break;
        }
        case 0x6: { // SBC: Rd = Rd - Rs - (~C)
            word rddata = get_register(state, instr->rd);
            word rsdata = get_register(state, instr->rs);
            uint64_t tmp = rsdata - state->cpsr.C + 1;

            word result = rddata - tmp;

            set_flags_sbc(state, rddata, rsdata, tmp, result);
            set_flags_nz(state, result);
            set_register(state, instr->rd, result);
            break;
        }
        case 0x7: { // ROR: Rd = Rd ROR Rs
            word newvalue = get_register(state, instr->rd);
            word shift_amount = get_register(state, instr->rs);
            newvalue = arm_ror(&state->cpsr, newvalue, shift_amount);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        case 0x8: { // TST: Set condition codes on Rd AND Rs
            set_flags_nz(state, get_register(state, instr->rd) & get_register(state, instr->rs));
            break;
        }
        case 0x9: { // NEG: Rd = -Rs
            word rsdata = get_register(state, instr->rs);
            word result = 0 - rsdata;
            set_flags_nz(state, result);
            set_flags_sub(state, 0, rsdata, result);
            set_register(state, instr->rd, result);
            break;
        }
        case 0xA: { // CMP: Set condition codes on Rd - Rs
            word rddata = get_register(state, instr->rd);
            word rsdata = get_register(state, instr->rs);
            word result = rddata - rsdata;
            set_flags_nz(state, result);
            set_flags_sub(state, rddata, rsdata, result);
            break;
        }
        case 0xB: { // CMN: Set condition codes on Rd + Rs
            set_flags_add(state, get_register(state, instr->rd), get_register(state, instr->rs));
            set_flags_nz(state, get_register(state, instr->rd) + get_register(state, instr->rs));
            break;
        }
        case 0xC: { // ORR: Rd = Rd | Rs
            word newvalue = get_register(state, instr->rd) | get_register(state, instr->rs);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        case 0xD: { // MUL: Rd = Rd * Rs
            word result = get_register(state, instr->rd) * get_register(state, instr->rs);
            set_flags_nz(state, result);
            set_register(state, instr->rd, result);
            break;
        }
        case 0xE: { // BIC: Rd = Rd & ~Rs
            word newvalue = get_register(state, instr->rd) & ~get_register(state, instr->rs);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        case 0xF: { // MVN: Rd = ~Rs
            word newvalue = ~get_register(state, instr->rs);
            set_flags_nz(state, newvalue);
            set_register(state, instr->rd, newvalue);
            break;
        }
        default:
            logfatal("Unknown ALU operations opcode: %d", instr->opcode)
    }
}